

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

NaReal __thiscall NaVector::average(NaVector *this)

{
  int iVar1;
  uint uVar2;
  long *in_RDI;
  uint i;
  NaReal sum;
  uint local_1c;
  double local_18;
  double local_8;
  
  iVar1 = (**(code **)(*in_RDI + 0x30))();
  if (iVar1 == 0) {
    local_8 = 0.0;
  }
  else {
    local_18 = 0.0;
    local_1c = 0;
    while( true ) {
      uVar2 = (**(code **)(*in_RDI + 0x30))();
      if (uVar2 <= local_1c) break;
      local_18 = *(double *)(in_RDI[2] + (ulong)local_1c * 8) + local_18;
      local_1c = local_1c + 1;
    }
    uVar2 = (**(code **)(*in_RDI + 0x30))();
    local_8 = local_18 / (double)uVar2;
  }
  return local_8;
}

Assistant:

NaReal
NaVector::average () const
{
    if(0 == dim())
        return 0.0;

    NaReal      sum = 0.0;
    unsigned    i;
    for(i = 0; i < dim(); ++i){
        sum += pVect[i];
    }
    return sum / dim();
}